

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

ssize_t fio_write2_fn(intptr_t uuid,fio_write_args_s options)

{
  short *psVar1;
  char cVar2;
  long *plVar3;
  fio_data_s *pfVar4;
  fio_packet_s *packet;
  int *piVar5;
  code *pcVar6;
  code *pcVar7;
  long *plVar8;
  undefined8 *puVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  fio_lock_i ret_1;
  fio_lock_i ret;
  
  if ((-1 < uuid) && (uVar10 = (uint)((ulong)uuid >> 8), uVar10 < fio_data->capa)) {
    lVar11 = (long)(int)uVar10 * 0xa8;
    cVar2 = *(char *)((long)fio_data + lVar11 + 0x6d);
    if (cVar2 == (char)uuid) {
      packet = (fio_packet_s *)fio_malloc(0x30);
      if (packet == (fio_packet_s *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:272"
                        );
        }
        kill(0,2);
        piVar5 = __errno_location();
        exit(*piVar5);
      }
      packet->next = (fio_packet_s *)0x0;
      packet->data = (anon_union_8_2_d0c08f9f_for_data)options.data;
      auVar12._0_8_ = options.offset;
      auVar12._8_4_ = (int)options.length;
      auVar12._12_4_ = options.length._4_4_;
      packet->offset = auVar12._0_8_;
      pfVar4 = fio_data;
      packet->length = auVar12._8_8_;
      if (((undefined1  [40])options & (undefined1  [40])0x2) == (undefined1  [40])0x0) {
        pcVar6 = (code *)options.after;
        if (options.after.dealloc == (_func_void_void_ptr *)0x0) {
          pcVar6 = free;
        }
        pcVar7 = fio_sock_write_buffer;
      }
      else {
        pcVar7 = fio_sock_write_from_fd;
        if (*(fio_rw_hook_s **)((long)fio_data + lVar11 + 0xa8) == &FIO_DEFAULT_RW_HOOKS) {
          pcVar7 = fio_sock_sendfile_from_fd;
        }
        pcVar6 = fio_sock_perform_close_fd;
        if (options.after.dealloc != (_func_void_void_ptr *)0x0) {
          pcVar6 = (code *)options.after;
        }
      }
      packet->write_func = pcVar7;
      packet->dealloc = pcVar6;
      fio_lock((fio_lock_i *)((long)pfVar4 + lVar11 + 0x6e));
      pfVar4 = fio_data;
      if ((uVar10 < fio_data->capa) && (*(char *)((long)fio_data + lVar11 + 0x6d) == cVar2)) {
        plVar8 = (long *)((long)fio_data + lVar11 + 0x40);
        plVar3 = (long *)*plVar8;
        if (((undefined1  [40])options & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
          puVar9 = (undefined8 *)((long)fio_data + lVar11 + 0x48);
          *(fio_packet_s **)*puVar9 = packet;
        }
        else {
          if (plVar3 != (long *)0x0) {
            plVar8 = plVar3;
          }
          packet->next = (fio_packet_s *)*plVar8;
          *plVar8 = (long)packet;
          if (packet->next != (fio_packet_s *)0x0) goto LAB_0012842f;
          puVar9 = (undefined8 *)((long)pfVar4 + lVar11 + 0x48);
        }
        *puVar9 = packet;
LAB_0012842f:
        LOCK();
        psVar1 = (short *)((long)pfVar4 + lVar11 + 0x68);
        *psVar1 = *psVar1 + 1;
        UNLOCK();
        LOCK();
        *(undefined1 *)((long)fio_data + lVar11 + 0x6e) = 0;
        UNLOCK();
        if (plVar3 != (long *)0x0) {
          return 0;
        }
        *(__time_t *)((long)fio_data + lVar11 + 0x60) = (fio_data->last_cycle).tv_sec;
        deferred_on_ready((void *)uuid,&DAT_00000001);
        return 0;
      }
      LOCK();
      *(undefined1 *)((long)fio_data + lVar11 + 0x6e) = 0;
      UNLOCK();
      fio_packet_free(packet);
      goto LAB_0012834c;
    }
  }
  if (options.after.dealloc != (_func_void_void_ptr *)0x0) {
    (*options.after.dealloc)(options.data.buffer);
  }
LAB_0012834c:
  piVar5 = __errno_location();
  *piVar5 = 9;
  return -1;
}

Assistant:

ssize_t fio_write2_fn(intptr_t uuid, fio_write_args_s options) {
  if (!uuid_is_valid(uuid))
    goto error;

  /* create packet */
  fio_packet_s *packet = fio_packet_alloc();
  *packet = (fio_packet_s){
      .length = options.length,
      .offset = options.offset,
      .data.buffer = (void *)options.data.buffer,
  };
  if (options.is_fd) {
    packet->write_func = (uuid_data(uuid).rw_hooks == &FIO_DEFAULT_RW_HOOKS)
                             ? fio_sock_sendfile_from_fd
                             : fio_sock_write_from_fd;
    packet->dealloc =
        (options.after.dealloc ? options.after.dealloc
                               : (void (*)(void *))fio_sock_perform_close_fd);
  } else {
    packet->write_func = fio_sock_write_buffer;
    packet->dealloc = (options.after.dealloc ? options.after.dealloc : free);
  }
  /* add packet to outgoing list */
  uint8_t was_empty = 1;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid)) {
    goto locked_error;
  }
  if (uuid_data(uuid).packet)
    was_empty = 0;
  if (options.urgent == 0) {
    *uuid_data(uuid).packet_last = packet;
    uuid_data(uuid).packet_last = &packet->next;
  } else {
    fio_packet_s **pos = &uuid_data(uuid).packet;
    if (*pos)
      pos = &(*pos)->next;
    packet->next = *pos;
    *pos = packet;
    if (!packet->next) {
      uuid_data(uuid).packet_last = &packet->next;
    }
  }
  fio_atomic_add(&uuid_data(uuid).packet_count, 1);
  fio_unlock(&uuid_data(uuid).sock_lock);

  if (was_empty) {
    touchfd(fio_uuid2fd(uuid));
    deferred_on_ready((void *)uuid, (void *)1);
  }
  return 0;
locked_error:
  fio_unlock(&uuid_data(uuid).sock_lock);
  fio_packet_free(packet);
  errno = EBADF;
  return -1;
error:
  if (options.after.dealloc) {
    options.after.dealloc((void *)options.data.buffer);
  }
  errno = EBADF;
  return -1;
}